

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void combine(gen_ctx_t gen_ctx,int no_property_p)

{
  int iVar1;
  bb_insn_t_conflict pbVar2;
  ulong local_d8;
  size_t hr;
  bb_t_conflict bb;
  long deleted_insns_num;
  long insns_num;
  int label_only_p;
  int block_change_p;
  int change_p;
  int out_p;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_op_t *op_ref;
  MIR_op_t temp_op;
  size_t curr_insn_num;
  size_t i;
  size_t nops;
  size_t iter;
  bb_insn_t_conflict next_bb_insn;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t new_insn;
  MIR_insn_t insn;
  MIR_insn_code_t new_code;
  MIR_insn_code_t code;
  MIR_context_t ctx;
  gen_ctx_t pgStack_10;
  int no_property_p_local;
  gen_ctx_t gen_ctx_local;
  
  _new_code = gen_ctx->ctx;
  deleted_insns_num = 0;
  bb = (bb_t_conflict)0x0;
  ctx._4_4_ = no_property_p;
  pgStack_10 = gen_ctx;
  if (gen_ctx->optimize_level != 0) {
    for (hr = (size_t)DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs); hr != 0;
        hr = (size_t)DLIST_bb_t_next((bb_t_conflict)hr)) {
      do {
        if ((pgStack_10->debug_file != (FILE *)0x0) && (1 < pgStack_10->debug_level)) {
          fprintf((FILE *)pgStack_10->debug_file,"Processing bb%lu\n",*(undefined8 *)hr);
        }
        insns_num._4_4_ = 0;
        pgStack_10->combine_ctx->curr_bb_var_ref_age =
             pgStack_10->combine_ctx->curr_bb_var_ref_age + 1;
        pgStack_10->combine_ctx->last_mem_ref_insn_num = 0;
        insns_num._0_4_ = 1;
        next_bb_insn = DLIST_bb_insn_t_head((DLIST_bb_insn_t *)(hr + 0x50));
        temp_op.u.mem.disp = 1;
        while (next_bb_insn != (bb_insn_t_conflict)0x0) {
          pbVar2 = DLIST_bb_insn_t_next(next_bb_insn);
          new_insn = next_bb_insn->insn;
          i = MIR_insn_nops(_new_code,new_insn);
          if ((int)*(undefined8 *)&new_insn->field_0x18 == 0xb4) {
            if ((int)insns_num == 0) {
              if ((pgStack_10->debug_file != (FILE *)0x0) && (1 < pgStack_10->debug_level)) {
                fprintf((FILE *)pgStack_10->debug_file,"  Remove label inside BB ");
                print_bb_insn(pgStack_10,next_bb_insn,1);
              }
              gen_delete_insn(pgStack_10,new_insn);
            }
          }
          else {
            insns_num._0_4_ = 0;
            deleted_insns_num = deleted_insns_num + 1;
            if ((pgStack_10->debug_file != (FILE *)0x0) && (1 < pgStack_10->debug_level)) {
              fprintf((FILE *)pgStack_10->debug_file,"  Processing ");
              print_bb_insn(pgStack_10,next_bb_insn,1);
            }
            if ((((int)*(undefined8 *)&new_insn->field_0x18 == 0xb6) ||
                ((int)*(undefined8 *)&new_insn->field_0x18 == 0xb7)) ||
               ((int)*(undefined8 *)&new_insn->field_0x18 == 0xb8)) {
              if (ctx._4_4_ != 0) {
                remove_property_insn(pgStack_10,new_insn);
              }
            }
            else {
              target_get_early_clobbered_hard_regs
                        (new_insn,(MIR_reg_t *)&out_p,(MIR_reg_t *)&change_p);
              if (out_p != -1) {
                setup_var_ref(pgStack_10,out_p,new_insn,0,temp_op.u.mem.disp,1);
              }
              if (change_p != -1) {
                setup_var_ref(pgStack_10,change_p,new_insn,0,temp_op.u.mem.disp,1);
              }
              insn._4_4_ = (MIR_insn_code_t)*(undefined8 *)&new_insn->field_0x18;
              iVar1 = MIR_call_code_p(insn._4_4_);
              if (iVar1 == 0) {
                if (insn._4_4_ == MIR_VA_BLOCK_ARG) {
                  pgStack_10->combine_ctx->last_mem_ref_insn_num = temp_op.u.mem.disp;
                }
                else if (insn._4_4_ != MIR_RET) {
                  bb_insn = (bb_insn_t_conflict)combine_exts(pgStack_10,next_bb_insn,(long *)&bb);
                  if (bb_insn == (bb_insn_t_conflict)0x0) {
                    label_only_p = combine_substitute(pgStack_10,&next_bb_insn,(long *)&bb);
                    if (label_only_p == 0) {
                      insn._0_4_ = commutative_insn_code
                                             ((MIR_insn_code_t)*(undefined8 *)&new_insn->field_0x18)
                      ;
                      if ((MIR_insn_code_t)insn != MIR_INSN_BOUND) {
                        *(ulong *)&new_insn->field_0x18 =
                             *(ulong *)&new_insn->field_0x18 & 0xffffffff00000000 |
                             (ulong)(MIR_insn_code_t)insn;
                        memcpy(&op_ref,new_insn + 1,0x30);
                        memcpy(new_insn + 1,&new_insn[1].ops[0].u,0x30);
                        memcpy(&new_insn[1].ops[0].u,&op_ref,0x30);
                        iVar1 = combine_substitute(pgStack_10,&next_bb_insn,(long *)&bb);
                        if (iVar1 == 0) {
                          *(ulong *)&new_insn->field_0x18 =
                               *(ulong *)&new_insn->field_0x18 & 0xffffffff00000000 |
                               (ulong)insn._4_4_;
                          memcpy(&op_ref,new_insn + 1,0x30);
                          memcpy(new_insn + 1,&new_insn[1].ops[0].u,0x30);
                          memcpy(&new_insn[1].ops[0].u,&op_ref,0x30);
                        }
                        else {
                          new_insn = next_bb_insn->insn;
                          i = MIR_insn_nops(_new_code,new_insn);
                          label_only_p = 1;
                        }
                      }
                    }
                    else {
                      new_insn = next_bb_insn->insn;
                      i = MIR_insn_nops(_new_code,new_insn);
                    }
                    if (label_only_p != 0) {
                      insns_num._4_4_ = 1;
                    }
                    if ((insn._4_4_ == MIR_BSTART) || (insn._4_4_ == MIR_BEND)) {
                      pgStack_10->combine_ctx->last_mem_ref_insn_num = temp_op.u.mem.disp;
                    }
                  }
                  else {
                    next_bb_insn = (bb_insn_t_conflict)bb_insn->insn;
                    new_insn = (MIR_insn_t)bb_insn;
                    i = MIR_insn_nops(_new_code,(MIR_insn_t_conflict)bb_insn);
                    insns_num._4_4_ = 1;
                  }
                }
              }
              else {
                for (local_d8 = 0; local_d8 < 0x22; local_d8 = local_d8 + 1) {
                  iVar1 = bitmap_bit_p(pgStack_10->call_used_hard_regs[0x12],local_d8);
                  if (iVar1 != 0) {
                    setup_var_ref(pgStack_10,(MIR_reg_t)local_d8,new_insn,0,temp_op.u.mem.disp,1);
                  }
                }
                pgStack_10->combine_ctx->last_mem_ref_insn_num = temp_op.u.mem.disp;
              }
              for (nops = 0; nops < 2; nops = nops + 1) {
                for (curr_insn_num = 0; curr_insn_num < i; curr_insn_num = curr_insn_num + 1) {
                  _early_clobbered_hard_reg2 = new_insn->ops + curr_insn_num;
                  MIR_insn_op_mode(_new_code,new_insn,curr_insn_num,&block_change_p);
                  if (((*(ushort *)&_early_clobbered_hard_reg2->field_0x8 & 0xff) == 2) &&
                     ((nops == 0) == (block_change_p == 0))) {
                    setup_var_ref(pgStack_10,(_early_clobbered_hard_reg2->u).reg,new_insn,
                                  curr_insn_num,temp_op.u.mem.disp,(uint)(nops == 1));
                  }
                  else if ((*(ushort *)&_early_clobbered_hard_reg2->field_0x8 & 0xff) == 0xb) {
                    if ((block_change_p == 0) || (nops != 1)) {
                      if (nops == 0) {
                        setup_var_ref(pgStack_10,(_early_clobbered_hard_reg2->u).mem.base,new_insn,
                                      curr_insn_num,temp_op.u.mem.disp,0);
                        setup_var_ref(pgStack_10,(_early_clobbered_hard_reg2->u).mem.index,new_insn,
                                      curr_insn_num,temp_op.u.mem.disp,0);
                      }
                    }
                    else {
                      pgStack_10->combine_ctx->last_mem_ref_insn_num = temp_op.u.mem.disp;
                    }
                  }
                }
              }
            }
          }
          temp_op.u.mem.disp = temp_op.u.mem.disp + 1;
          next_bb_insn = pbVar2;
        }
      } while (insns_num._4_4_ != 0);
    }
    if ((pgStack_10->debug_file != (FILE *)0x0) && (0 < pgStack_10->debug_level)) {
      fprintf((FILE *)pgStack_10->debug_file,"%5ld deleted combine insns out of %ld (%.1f%%)\n",
              ((double)(long)bb * 100.0) / (double)deleted_insns_num,bb,deleted_insns_num);
    }
    return;
  }
  __assert_fail("gen_ctx->optimize_level > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2317,"void combine(gen_ctx_t, int)");
}

Assistant:

static void combine (gen_ctx_t gen_ctx, int no_property_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_insn_code_t code, new_code;
  MIR_insn_t insn, new_insn;
  bb_insn_t bb_insn, next_bb_insn;
  size_t iter, nops, i, curr_insn_num;
  MIR_op_t temp_op, *op_ref;
  MIR_reg_t early_clobbered_hard_reg1, early_clobbered_hard_reg2;
  int out_p, change_p, block_change_p, label_only_p;
  long insns_num = 0, deleted_insns_num = 0;

  gen_assert (optimize_level > 0);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    do {
      DEBUG (2, { fprintf (debug_file, "Processing bb%lu\n", (unsigned long) bb->index); });
      block_change_p = FALSE;
      curr_bb_var_ref_age++;
      last_mem_ref_insn_num = 0; /* means undef */
      label_only_p = TRUE;
      for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns), curr_insn_num = 1; bb_insn != NULL;
           bb_insn = next_bb_insn, curr_insn_num++) {
        next_bb_insn = DLIST_NEXT (bb_insn_t, bb_insn);
        insn = bb_insn->insn;
        nops = MIR_insn_nops (ctx, insn);
        if (insn->code == MIR_LABEL) {
          if (!label_only_p) {
            /* We can move insns with temp hard regs inside BB. It
               is important to remove labels inside BB as we use labels to find BBs for lazy BB
               generation and temp regs can be used between BBs in this generation mode. */
            DEBUG (2, {
              fprintf (debug_file, "  Remove label inside BB ");
              print_bb_insn (gen_ctx, bb_insn, TRUE);
            });
            gen_delete_insn (gen_ctx, insn);
          }
          continue;
        }
        label_only_p = FALSE;
        insns_num++;
        DEBUG (2, {
          fprintf (debug_file, "  Processing ");
          print_bb_insn (gen_ctx, bb_insn, TRUE);
        });
        if (insn->code == MIR_PRSET || insn->code == MIR_PRBEQ || insn->code == MIR_PRBNE) {
          if (no_property_p) remove_property_insn (gen_ctx, insn);
          continue;
        }
        target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                              &early_clobbered_hard_reg2);
        if (early_clobbered_hard_reg1 != MIR_NON_VAR)
          setup_var_ref (gen_ctx, early_clobbered_hard_reg1, insn, 0 /* whatever */, curr_insn_num,
                         TRUE);
        if (early_clobbered_hard_reg2 != MIR_NON_VAR)
          setup_var_ref (gen_ctx, early_clobbered_hard_reg2, insn, 0 /* whatever */, curr_insn_num,
                         TRUE);
        if (MIR_call_code_p (code = insn->code)) {
          for (size_t hr = 0; hr <= MAX_HARD_REG; hr++)
            if (bitmap_bit_p (call_used_hard_regs[MIR_T_UNDEF], hr)) {
              setup_var_ref (gen_ctx, (MIR_reg_t) hr, insn, 0 /* whatever */, curr_insn_num, TRUE);
            }
          last_mem_ref_insn_num = curr_insn_num; /* Potentially call can change memory */
        } else if (code == MIR_VA_BLOCK_ARG) {
          last_mem_ref_insn_num = curr_insn_num; /* Change memory */
        } else if (code == MIR_RET) {
          /* ret is transformed in machinize and should be not modified after that */
        } else if ((new_insn = combine_exts (gen_ctx, bb_insn, &deleted_insns_num)) != NULL) {
          /* ssa ext removal is not enough as we can add ext insn in machinize for args and rets
           */
          bb_insn = new_insn->data;
          insn = new_insn;
          nops = MIR_insn_nops (ctx, insn);
          block_change_p = TRUE;
        } else {
          if ((change_p = combine_substitute (gen_ctx, &bb_insn, &deleted_insns_num))) {
            insn = bb_insn->insn;
            nops = MIR_insn_nops (ctx, insn);
          } else if (!change_p
                     && (new_code = commutative_insn_code (insn->code)) != MIR_INSN_BOUND) {
            insn->code = new_code;
            temp_op = insn->ops[1];
            insn->ops[1] = insn->ops[2];
            insn->ops[2] = temp_op;
            if (combine_substitute (gen_ctx, &bb_insn, &deleted_insns_num)) {
              insn = bb_insn->insn;
              nops = MIR_insn_nops (ctx, insn);
              change_p = TRUE;
            } else {
              insn->code = code;
              temp_op = insn->ops[1];
              insn->ops[1] = insn->ops[2];
              insn->ops[2] = temp_op;
            }
          }
          if (change_p) block_change_p = TRUE;
          if (code == MIR_BSTART || code == MIR_BEND) last_mem_ref_insn_num = curr_insn_num;
        }

        for (iter = 0; iter < 2; iter++) { /* update var ref info: */
          for (i = 0; i < nops; i++) {
            op_ref = &insn->ops[i];
            MIR_insn_op_mode (ctx, insn, i, &out_p);
            if (op_ref->mode == MIR_OP_VAR && !iter == !out_p) {
              /* process in ops on 0th iteration and out ops on 1th iteration */
              setup_var_ref (gen_ctx, op_ref->u.var, insn, i, curr_insn_num, iter == 1);
            } else if (op_ref->mode == MIR_OP_VAR_MEM) {
              if (out_p && iter == 1)
                last_mem_ref_insn_num = curr_insn_num;
              else if (iter == 0) {
                setup_var_ref (gen_ctx, op_ref->u.var_mem.base, insn, i, curr_insn_num, FALSE);
                setup_var_ref (gen_ctx, op_ref->u.var_mem.index, insn, i, curr_insn_num, FALSE);
              }
            }
          }
        }
      }
    } while (block_change_p);
  }
  DEBUG (1, {
    fprintf (debug_file, "%5ld deleted combine insns out of %ld (%.1f%%)\n", deleted_insns_num,
             insns_num, 100.0 * deleted_insns_num / insns_num);
  });
}